

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse
          (Impl *this,StateCreatorInterface *iface,DatabaseInterface *resolver,void *buffer_,
          size_t total_size)

{
  uchar *varint_size;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uchar *puVar4;
  Type pGVar5;
  Type pdf_info;
  Ch *str;
  uint64_t uVar6;
  ParseErrorCode error;
  Impl *this_00;
  uchar *varint;
  long *in_FS_OFFSET;
  Document doc;
  
  doc.
  super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  .data_.ss.str[0] = '\0';
  puVar4 = std::__find_if<unsigned_char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (buffer_);
  varint = puVar4 + 1;
  varint_size = (uchar *)(total_size + (long)buffer_) + -(long)(puVar4 + 1);
  if ((uchar *)(total_size + (long)buffer_) <= puVar4) {
    varint = (uchar *)0x0;
    varint_size = (uchar *)0x0;
  }
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::GenericDocument(&doc,(MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0,0x400,
                    (CrtAllocator *)0x0);
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
  ::Parse<0u,rapidjson::UTF8<char>>
            ((GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>
              *)&doc,(Ch *)buffer_,(long)puVar4 - (long)buffer_);
  if (doc.parseResult_.code_ == kParseErrorNone) {
    pGVar5 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
             ::operator[]<char_const>
                       ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                         *)&doc,"version");
    iVar3 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(pGVar5);
    if (0xfffffffd < iVar3 - 7U) {
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"applicationInfo");
      if ((bVar2) &&
         (bVar2 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::HasMember(&doc.
                               super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                              ,"physicalDeviceFeatures"), bVar2)) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"applicationInfo");
        pdf_info = rapidjson::
                   GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                   ::operator[]<char_const>
                             ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                               *)&doc,"physicalDeviceFeatures");
        bVar2 = parse_application_info(this,iface,pGVar5,pdf_info);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"application");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"application");
        str = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetString(pGVar5);
        uVar6 = string_to_uint64(str);
        (**(code **)(*(long *)iface + 0x18))(iface,uVar6);
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"link");
      if (bVar2) {
        this_00 = (Impl *)&doc;
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)this_00,"link");
        parse_application_info_link(this_00,iface,pGVar5);
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"shaderModules");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"shaderModules");
        bVar2 = parse_shader_modules(this,iface,pGVar5,varint,(size_t)varint_size);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"samplers");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"samplers");
        bVar2 = parse_samplers(this,iface,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"setLayouts");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"setLayouts");
        bVar2 = parse_descriptor_set_layouts(this,iface,resolver,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"pipelineLayouts");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"pipelineLayouts");
        bVar2 = parse_pipeline_layouts(this,iface,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"renderPasses");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"renderPasses");
        bVar2 = parse_render_passes(this,iface,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"renderPasses2");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"renderPasses2");
        bVar2 = parse_render_passes2(this,iface,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"computePipelines");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"computePipelines");
        bVar2 = parse_compute_pipelines(this,iface,resolver,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"graphicsPipelines");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"graphicsPipelines");
        bVar2 = parse_graphics_pipelines(this,iface,resolver,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::HasMember(&doc.
                           super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                          ,"raytracingPipelines");
      if (bVar2) {
        pGVar5 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                 ::operator[]<char_const>
                           ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                             *)&doc,"raytracingPipelines");
        bVar2 = parse_raytracing_pipelines(this,iface,resolver,pGVar5);
        if (!bVar2) goto LAB_00110945;
      }
      bVar2 = true;
      goto LAB_00110947;
    }
    if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
      bVar2 = false;
      bVar1 = Internal::log_thread_callback(LOG_ERROR,"JSON version mismatches.");
      if (bVar1) goto LAB_00110947;
      fwrite("Fossilize ERROR: JSON version mismatches.",0x29,1,_stderr);
    }
  }
  else if (*(int *)(*in_FS_OFFSET + -0x18) < 3) {
    bVar2 = false;
    bVar1 = Internal::log_thread_callback
                      (LOG_ERROR,"Got parse error: %d\n",(ulong)doc.parseResult_.code_);
    if (!bVar1) {
      bVar2 = false;
      fprintf(_stderr,"Fossilize ERROR: Got parse error: %d\n",(ulong)doc.parseResult_.code_);
    }
    goto LAB_00110947;
  }
LAB_00110945:
  bVar2 = false;
LAB_00110947:
  rapidjson::
  GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
  ::~GenericDocument(&doc);
  return bVar2;
}

Assistant:

bool StateReplayer::Impl::parse(StateCreatorInterface &iface, DatabaseInterface *resolver, const void *buffer_, size_t total_size)
{
	// All data after a string terminating '\0' is considered binary payload
	// which can be read for various purposes (SPIR-V varint for example).
	const uint8_t *buffer = static_cast<const uint8_t *>(buffer_);
	auto itr = find(buffer, buffer + total_size, '\0');
	const uint8_t *varint_buffer = nullptr;
	size_t varint_size = 0;
	size_t json_size = itr - buffer;

	if (itr < buffer + total_size)
	{
		varint_buffer = itr + 1;
		varint_size = (buffer + total_size) - varint_buffer;
	}

	Document doc;
	doc.Parse(reinterpret_cast<const char *>(buffer), json_size);

	if (doc.HasParseError())
	{
		auto error = doc.GetParseError();
		LOGE_LEVEL("Got parse error: %d\n", int(error));
		return false;
	}

	int version = doc["version"].GetInt();
	if (version > FOSSILIZE_FORMAT_VERSION || version < FOSSILIZE_FORMAT_MIN_COMPAT_VERSION)
	{
		LOGE_LEVEL("JSON version mismatches.");
		return false;
	}

	if (doc.HasMember("applicationInfo") && doc.HasMember("physicalDeviceFeatures"))
		if (!parse_application_info(iface, doc["applicationInfo"], doc["physicalDeviceFeatures"]))
			return false;

	if (doc.HasMember("application"))
		iface.set_current_application_info(string_to_uint64(doc["application"].GetString()));

	if (doc.HasMember("link"))
		if (!parse_application_info_link(iface, doc["link"]))
			return false;

	if (doc.HasMember("shaderModules"))
		if (!parse_shader_modules(iface, doc["shaderModules"], varint_buffer, varint_size))
			return false;

	if (doc.HasMember("samplers"))
		if (!parse_samplers(iface, doc["samplers"]))
			return false;

	if (doc.HasMember("setLayouts"))
		if (!parse_descriptor_set_layouts(iface, resolver, doc["setLayouts"]))
			return false;

	if (doc.HasMember("pipelineLayouts"))
		if (!parse_pipeline_layouts(iface, doc["pipelineLayouts"]))
			return false;

	if (doc.HasMember("renderPasses"))
		if (!parse_render_passes(iface, doc["renderPasses"]))
			return false;

	if (doc.HasMember("renderPasses2"))
		if (!parse_render_passes2(iface, doc["renderPasses2"]))
			return false;

	if (doc.HasMember("computePipelines"))
		if (!parse_compute_pipelines(iface, resolver, doc["computePipelines"]))
			return false;

	if (doc.HasMember("graphicsPipelines"))
		if (!parse_graphics_pipelines(iface, resolver, doc["graphicsPipelines"]))
			return false;

	if (doc.HasMember("raytracingPipelines"))
		if (!parse_raytracing_pipelines(iface, resolver, doc["raytracingPipelines"]))
			return false;

	return true;
}